

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,FileReader *reader)

{
  int *piVar1;
  OPLio *pOVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  BYTE *pBVar6;
  undefined4 extraout_var;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_006efba8;
  iVar5 = (int)reader->Length;
  this->ScoreLen = iVar5;
  if ((this->super_OPLmusicBlock).super_musicBlock.io == (OPLio *)0x0) {
    return;
  }
  pBVar6 = (BYTE *)operator_new__((long)iVar5);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = pBVar6;
  iVar5 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar6,(long)iVar5);
  if (CONCAT44(extraout_var,iVar5) == (long)this->ScoreLen) {
    pOVar2 = (this->super_OPLmusicBlock).super_musicBlock.io;
    iVar5 = (*pOVar2->_vptr_OPLio[2])(pOVar2,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0,0);
    (this->super_OPLmusicBlock).NumChips = iVar5;
    if (iVar5 == 0) goto LAB_0033650e;
    piVar11 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
    iVar5 = *piVar11;
    if (iVar5 == 0x41524244) {
      if (piVar11[1] == 0x4c504f57) {
        if (*(short *)((long)piVar11 + 10) == 1) {
          this->RawPlayer = DosBox1;
          (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
          iVar5 = this->ScoreLen + -0x18;
          if (piVar11[4] <= iVar5) {
            iVar5 = piVar11[4];
          }
          iVar5 = iVar5 + 0x18;
LAB_003364a4:
          this->ScoreLen = iVar5;
LAB_003364aa:
          (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])(this);
          return;
        }
        if (piVar11[2] == 2) {
          if (*(char *)((long)piVar11 + 0x15) == '\0') {
            uVar10 = 0;
            if (*(char *)((long)piVar11 + 0x16) == '\0') {
              this->RawPlayer = DosBox2;
              (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
              iVar9 = this->ScoreLen - (*(byte *)((long)piVar11 + 0x19) + 0x1a);
              iVar5 = piVar11[3] * 2;
              if (iVar9 < piVar11[3] * 2) {
                iVar5 = iVar9;
              }
              iVar5 = (uint)*(byte *)((long)piVar11 + 0x19) + iVar5 + 0x1a;
              goto LAB_003364a4;
            }
          }
          else {
            Printf("Unsupported DOSBox Raw OPL format %d\n",(ulong)*(byte *)(piVar11 + 5));
            piVar11 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
            if (*(char *)((long)piVar11 + 0x16) == '\0') goto LAB_00336517;
            uVar10 = (ulong)*(byte *)((long)piVar11 + 0x15);
          }
          Printf("Unsupported DOSBox Raw OPL compression %d\n",uVar10);
        }
        else {
          Printf("Unsupported DOSBox Raw OPL version %d.%d\n",(ulong)(piVar11[2] & 0xffff));
        }
      }
      goto LAB_0033650e;
    }
    if (iVar5 == 0x494c4441) {
      if (((char)piVar11[1] != 'B') || (*(char *)((long)piVar11 + 5) != '\x01')) goto LAB_0033650e;
      iVar5 = this->ScoreLen;
      piVar1 = (int *)((long)piVar11 + (long)iVar5);
      this->RawPlayer = IMF;
      (this->super_OPLmusicBlock).SamplesPerTick = 71.02285714285715;
      (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)((long)piVar11 + 6);
      iVar9 = 2;
      piVar12 = (int *)((long)piVar11 + 6);
LAB_00336406:
      do {
        piVar7 = piVar12;
        if (piVar12 < piVar1) {
          piVar7 = (int *)((long)piVar12 + 1);
          (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)piVar7;
          iVar3 = *piVar12;
          piVar12 = piVar7;
          if ((char)iVar3 != '\0') goto LAB_00336406;
        }
        iVar9 = iVar9 + -1;
        piVar12 = piVar7;
      } while (iVar9 != 0);
      if (piVar7 < piVar1) {
        piVar7 = (int *)((long)piVar7 + 1);
        (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)piVar7;
      }
      if (piVar7 + 2 <= piVar1) {
        if ((long)*piVar7 != 0) {
          lVar8 = (long)*piVar7 + 4;
          if (lVar8 < (long)iVar5 - ((long)piVar7 - (long)piVar11)) {
            this->ScoreLen = (int)((long)piVar7 - (long)piVar11) + (int)lVar8;
          }
        }
        goto LAB_003364aa;
      }
    }
    else if (iVar5 == 0x41574152) {
      if (piVar11[1] == 0x41544144) {
        this->RawPlayer = RDosPlay;
        uVar4 = *(ushort *)(piVar11 + 2);
        if (uVar4 == 0) {
          *(undefined2 *)(piVar11 + 2) = 0xffff;
          uVar4 = 0xffff;
        }
        (this->super_OPLmusicBlock).SamplesPerTick = (double)uVar4 * 0.041666666666666664;
        goto LAB_003364aa;
      }
      goto LAB_0033650e;
    }
  }
  else {
LAB_0033650e:
    piVar11 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
    if (piVar11 == (int *)0x0) goto LAB_0033651c;
  }
LAB_00336517:
  operator_delete__(piVar11);
LAB_0033651c:
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile (FileReader *reader)
	: ScoreLen (reader->GetLength())
{
	if (io == NULL)
	{
		return;
	}

	scoredata = new BYTE[ScoreLen];

    if (reader->Read(scoredata, ScoreLen) != ScoreLen)
    {
fail:	delete[] scoredata;
        scoredata = NULL;
        return;
    }

	if (0 == (NumChips = io->OPLinit(NumChips)))
	{
		goto fail;
	}

	// Check for RDosPlay raw OPL format
	if (((DWORD *)scoredata)[0] == MAKE_ID('R','A','W','A') &&
			 ((DWORD *)scoredata)[1] == MAKE_ID('D','A','T','A'))
	{
		RawPlayer = RDosPlay;
		if (*(WORD *)(scoredata + 8) == 0)
		{ // A clock speed of 0 is bad
			*(WORD *)(scoredata + 8) = 0xFFFF; 
		}
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
	}
	// Check for DosBox OPL dump
	else if (((DWORD *)scoredata)[0] == MAKE_ID('D','B','R','A') &&
		((DWORD *)scoredata)[1] == MAKE_ID('W','O','P','L'))
	{
		if (LittleShort(((WORD *)scoredata)[5]) == 1)
		{
			RawPlayer = DosBox1;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			ScoreLen = MIN<int>(ScoreLen - 24, LittleLong(((DWORD *)scoredata)[4])) + 24;
		}
		else if (((DWORD *)scoredata)[2] == MAKE_ID(2,0,0,0))
		{
			bool okay = true;
			if (scoredata[21] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL format %d\n", scoredata[20]);
				okay = false;
			}
			if (scoredata[22] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL compression %d\n", scoredata[21]);
				okay = false;
			}
			if (!okay)
				goto fail;
			RawPlayer = DosBox2;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			int headersize = 0x1A + scoredata[0x19];
			ScoreLen = MIN<int>(ScoreLen - headersize, LittleLong(((DWORD *)scoredata)[3]) * 2) + headersize;
		}
		else
		{
			Printf("Unsupported DOSBox Raw OPL version %d.%d\n", LittleShort(((WORD *)scoredata)[4]), LittleShort(((WORD *)scoredata)[5]));
			goto fail;
		}
	}
	// Check for modified IMF format (includes a header)
	else if (((DWORD *)scoredata)[0] == MAKE_ID('A','D','L','I') &&
		     scoredata[4] == 'B' && scoredata[5] == 1)
	{
		int songlen;
		BYTE *max = scoredata + ScoreLen;
		RawPlayer = IMF;
		SamplesPerTick = OPL_SAMPLE_RATE / IMF_RATE;

		score = scoredata + 6;
		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (score < max && *score++ != '\0') {}
		}
		if (score < max) score++;	// Skip unknown byte
		if (score + 8 > max)
		{ // Not enough room left for song data
			delete[] scoredata;
			scoredata = NULL;
			return;
		}
		songlen = LittleLong(*(DWORD *)score);
		if (songlen != 0 && (songlen +=4) < ScoreLen - (score - scoredata))
		{
			ScoreLen = songlen + int(score - scoredata);
		}
	}
	else
	{
		goto fail;
	}

	Restart ();
}